

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O2

size_t __thiscall
webfront::fs::File::readFStream(File *this,span<char,_18446744073709551615UL> buffer)

{
  std::istream::read((char *)&this->fstream,(long)buffer._M_ptr);
  if (((&this->field_0x70)[*(long *)(*(long *)&this->fstream + -0x18)] & 2) != 0) {
    this->eofBit = true;
    std::ifstream::close();
  }
  return *(size_t *)&this->field_0x58;
}

Assistant:

size_t readFStream(std::span<char> buffer) {
        fstream.read(buffer.data(), static_cast<std::streamsize>(buffer.size()));
        if (fstream.eof()) {
            eofBit = true;
            fstream.close();
        }
        return static_cast<size_t>(fstream.gcount());
    }